

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::setTipPartials
          (BeagleCPUImpl<double,_1,_0> *this,int tipIndex,double *inPartials)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double *__s;
  double *__src;
  double *__dest;
  long lVar5;
  uint uVar6;
  void *ptr;
  double *local_38;
  
  iVar3 = -5;
  if ((-1 < tipIndex) && (tipIndex < this->kTipCount)) {
    __s = this->gPartials[(uint)tipIndex];
    if (__s == (double *)0x0) {
      local_38 = (double *)0x0;
      posix_memalign(&local_38,0x20,(long)this->kPartialsSize << 3);
      this->gPartials[(uint)tipIndex] = local_38;
      __s = this->gPartials[(uint)tipIndex];
      if (__s == (double *)0x0) {
        return -2;
      }
    }
    if (0 < this->kCategoryCount) {
      iVar3 = this->kPatternCount;
      iVar2 = 0;
      do {
        if (iVar3 < 1) {
          iVar1 = this->kPartialsPaddedStateCount;
        }
        else {
          uVar6 = this->kStateCount;
          iVar4 = 0;
          __src = inPartials;
          __dest = __s;
          do {
            memcpy(__dest,__src,(ulong)uVar6 << 3);
            uVar6 = this->kStateCount;
            iVar1 = this->kPartialsPaddedStateCount;
            lVar5 = (long)(int)uVar6;
            __s = __dest + lVar5;
            if ((int)uVar6 < iVar1) {
              memset(__s,0,(ulong)(~uVar6 + iVar1) * 8 + 8);
              __s = __dest + (ulong)(~uVar6 + iVar1) + lVar5 + 1;
            }
            __src = __src + lVar5;
            iVar4 = iVar4 + 1;
            iVar3 = this->kPatternCount;
            __dest = __s;
          } while (iVar4 < iVar3);
        }
        uVar6 = (this->kPaddedPatternCount - iVar3) * iVar1;
        if (0 < (int)uVar6) {
          memset(__s,0,(ulong)uVar6 << 3);
          __s = __s + (ulong)(uVar6 - 1) + 1;
        }
        iVar2 = iVar2 + 1;
      } while (iVar2 < this->kCategoryCount);
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setTipPartials(int tipIndex,
                                  const double* inPartials) {
    if (tipIndex < 0 || tipIndex >= kTipCount)
        return BEAGLE_ERROR_OUT_OF_RANGE;
    if(gPartials[tipIndex] == NULL) {
        gPartials[tipIndex] = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPartialsSize);
        // TODO: What if this throws a memory full error?
        if (gPartials[tipIndex] == 0L)
            return BEAGLE_ERROR_OUT_OF_MEMORY;
    }

    const double* inPartialsOffset;
    REALTYPE* tmpRealPartialsOffset = gPartials[tipIndex];
    for (int l = 0; l < kCategoryCount; l++) {
        inPartialsOffset = inPartials;
        for (int i = 0; i < kPatternCount; i++) {
            beagleMemCpy(tmpRealPartialsOffset, inPartialsOffset, kStateCount);
            tmpRealPartialsOffset += kStateCount;
            // Pad extra buffer with zeros
            for(int k = kStateCount; k < kPartialsPaddedStateCount; k++) {
                *tmpRealPartialsOffset++ = 0;
            }
            inPartialsOffset += kStateCount;
        }
        // Pad extra buffer with zeros
        for(int k = 0; k < kPartialsPaddedStateCount * (kPaddedPatternCount - kPatternCount); k++) {
            *tmpRealPartialsOffset++ = 0;
        }
    }

    return BEAGLE_SUCCESS;
}